

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QTzType>::resize(QList<QTzType> *this,qsizetype size)

{
  QTzType *pQVar1;
  Data *pDVar2;
  long lVar3;
  QTzType *pQVar4;
  QTzType QVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QTzType>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QTzType **)0x0,
               (QArrayDataPointer<QTzType> *)0x0);
  }
  else if (size < (this->d).size) {
    (this->d).size = size;
  }
  lVar3 = (this->d).size;
  if (lVar3 < size) {
    pQVar4 = (this->d).ptr;
    pQVar1 = pQVar4 + lVar3;
    pQVar1->tz_gmtoff = 0;
    auVar7 = _DAT_004da380;
    auVar6 = _DAT_004d91f0;
    pQVar1->tz_isdst = false;
    pQVar1->tz_abbrind = '\0';
    *(undefined2 *)&pQVar1->field_0x6 = 0;
    if (pQVar1 + 1 != pQVar4 + size) {
      pQVar4 = pQVar4 + lVar3;
      uVar8 = (size * 8 + lVar3 * -8) - 0x10;
      auVar12._8_4_ = (int)uVar8;
      auVar12._0_8_ = uVar8;
      auVar12._12_4_ = (int)(uVar8 >> 0x20);
      auVar10._0_8_ = uVar8 >> 3;
      auVar10._8_8_ = auVar12._8_8_ >> 3;
      uVar9 = 0;
      auVar10 = auVar10 ^ _DAT_004d91f0;
      do {
        auVar11._8_4_ = (int)uVar9;
        auVar11._0_8_ = uVar9;
        auVar11._12_4_ = (int)(uVar9 >> 0x20);
        auVar12 = (auVar11 | auVar7) ^ auVar6;
        QVar5 = *pQVar4;
        if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                    auVar10._4_4_ < auVar12._4_4_) & 1)) {
          pQVar4[uVar9 + 1] = QVar5;
        }
        if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
            auVar12._12_4_ <= auVar10._12_4_) {
          pQVar4[uVar9 + 2] = QVar5;
        }
        uVar9 = uVar9 + 2;
      } while (((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != uVar9);
    }
    (this->d).size = size;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }